

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx2_gemm.h
# Opt level: O2

void __thiscall
intgemm::AVX2::Kernels8::PrepareBTransposed
          (Kernels8 *this,float *input,int8_t *output,float quant_mult,Index cols,Index rows)

{
  undefined8 *puVar1;
  FRegister quant_mult_00;
  ulong uVar2;
  uint cols_left;
  uint uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  float *local_b8;
  
  uVar3 = 0;
  uVar2 = 0;
  local_b8 = input;
  while (uVar3 < cols) {
    cols_left = (uint)output;
    uVar5 = cols_left * uVar3;
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 0x20) {
      uVar7 = CONCAT44(quant_mult,quant_mult);
      uVar8 = CONCAT44(quant_mult,quant_mult);
      uVar9 = CONCAT44(quant_mult,quant_mult);
      uVar10 = CONCAT44(quant_mult,quant_mult);
      quant_mult_00[2] = quant_mult;
      quant_mult_00[3] = quant_mult;
      quant_mult_00[0] = quant_mult;
      quant_mult_00[1] = quant_mult;
      quant_mult_00[4] = quant_mult;
      quant_mult_00[5] = quant_mult;
      quant_mult_00[6] = quant_mult;
      quant_mult_00[7] = quant_mult;
      QuantizeTile8::ConsecutiveWithWrapping
                ((Register *)(this + (ulong)uVar5 * 4 + uVar2 * 4),quant_mult_00,
                 (float *)(ulong)(cols_left - (int)uVar2),cols_left,8,rows);
      puVar1 = (undefined8 *)((long)local_b8 + lVar4);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      puVar1[2] = uVar9;
      puVar1[3] = uVar10;
      uVar5 = uVar5 + cols_left;
    }
    uVar5 = (int)uVar2 + 0x20;
    local_b8 = local_b8 + 0x40;
    while( true ) {
      uVar2 = (ulong)uVar5;
      bVar6 = uVar5 < cols_left;
      uVar5 = uVar5 - cols_left;
      if (bVar6) break;
      uVar3 = uVar3 + 8;
    }
  }
  return;
}

Assistant:

INTGEMM_AVX2 static void SelectColumnsB(const int8_t *input, int8_t *output, Index rows, const Index *cols_begin, const Index *cols_end) {
    AVX2::SelectColumnsOfB((const __m256i*)input, (__m256i*)output, rows, cols_begin, cols_end);
  }